

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindow * FindWindowNavFocusable(int i_start,int i_stop,int dir)

{
  ImGuiContext *pIVar1;
  ImGuiWindow **ppIVar2;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  bool bVar3;
  int i;
  ImGuiContext *g;
  int local_24;
  
  pIVar1 = GImGui;
  local_24 = in_EDI;
  while( true ) {
    bVar3 = false;
    if ((-1 < local_24) && (bVar3 = false, local_24 < (pIVar1->WindowsFocusOrder).Size)) {
      bVar3 = local_24 != in_ESI;
    }
    if (!bVar3) break;
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->WindowsFocusOrder,local_24);
    bVar3 = ImGui::IsWindowNavFocusable(*ppIVar2);
    if (bVar3) {
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->WindowsFocusOrder,local_24);
      return *ppIVar2;
    }
    local_24 = in_EDX + local_24;
  }
  return (ImGuiWindow *)0x0;
}

Assistant:

static ImGuiWindow* FindWindowNavFocusable(int i_start, int i_stop, int dir) // FIXME-OPT O(N)
{
    ImGuiContext& g = *GImGui;
    for (int i = i_start; i >= 0 && i < g.WindowsFocusOrder.Size && i != i_stop; i += dir)
        if (ImGui::IsWindowNavFocusable(g.WindowsFocusOrder[i]))
            return g.WindowsFocusOrder[i];
    return NULL;
}